

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_DeleteModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,char *moduleId)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  char *moduleId_local;
  char *deviceId_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) || (deviceId == (char *)0x0))
     || (moduleId == (char *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_DeleteModule",0x7ee,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    l._4_4_ = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_DELETE,deviceId,moduleId,
                                  (BUFFER_HANDLE)0x0,0,(BUFFER_HANDLE)0x0);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_DeleteModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, const char* moduleId)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (moduleId == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_DELETE, deviceId, moduleId, NULL, 0, NULL);
    }
    return result;
}